

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bend.hpp
# Opt level: O0

void __thiscall OpenMD::Bend::~Bend(Bend *this)

{
  Bend *in_RDI;
  
  ~Bend(in_RDI);
  operator_delete(in_RDI,0x98);
  return;
}

Assistant:

virtual ~Bend() {}